

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JHandler.cpp
# Opt level: O3

void __thiscall JHandler::JHandler(JHandler *this,string *cfg)

{
  int iVar1;
  uint uVar2;
  size_type sVar3;
  element_type *peVar4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  string *psVar9;
  value_variant *pvVar10;
  size_t sVar11;
  long *plVar12;
  long lVar13;
  long lVar14;
  size_type *psVar15;
  uint i;
  ulong uVar16;
  undefined8 uVar17;
  char *pcVar18;
  char *pcVar19;
  undefined8 uVar20;
  ulong uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  double dVar22;
  json_value_data_t local_c8;
  int local_b8;
  pool_allocator local_a0;
  undefined4 local_70;
  void *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bc98;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[3]._M_use_count = 0;
  p_Var8[3]._M_weak_count = 0;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[2]._M_use_count = 0;
  p_Var8[2]._M_weak_count = 0;
  p_Var8[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[4]._M_use_count = 0;
  p_Var8[4]._M_weak_count = 0;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)(p_Var8 + 2);
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)(p_Var8 + 4);
  (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var8;
  (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0010bd10;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[3]._M_use_count = 0;
  p_Var8[3]._M_weak_count = 0;
  p_Var8[5]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[5]._M_use_count = 0;
  p_Var8[5]._M_weak_count = 0;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[2]._M_use_count = 0;
  p_Var8[2]._M_weak_count = 0;
  p_Var8[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[4]._M_use_count = 0;
  p_Var8[4]._M_weak_count = 0;
  p_Var8[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[6]._M_use_count = 0;
  p_Var8[6]._M_weak_count = 0;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)(p_Var8 + 2);
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)(p_Var8 + 4);
  p_Var8[5]._vptr__Sp_counted_base = (_func_int **)(p_Var8 + 6);
  (this->MD_ptr).super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var8;
  (this->MD_ptr).super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  this_00 = &this->error_msg;
  (this->error_msg)._M_dataplus._M_p = (pointer)&(this->error_msg).field_2;
  (this->error_msg)._M_string_length = 0;
  (this->error_msg).field_2._M_local_buf[0] = '\0';
  this->status = false;
  local_b8 = 0;
  local_c8.m_object.m_p = (key_value_t *)0x0;
  local_a0.m_pActive_chunks = (chunk *)0x0;
  local_a0.m_pFree_chunks._0_4_ = 0;
  local_a0.m_pFree_chunks._4_4_ = 0;
  local_a0.m_total_free_bytes._0_4_ = 0;
  local_a0._20_8_ = 0;
  local_a0.m_min_chunk_size = 0x1000;
  local_a0.m_max_to_preserve_across_resets = 0x1000000;
  local_a0.m_cur_grow_size = 0x1000;
  local_70 = 0;
  local_68 = (void *)0x0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  bVar6 = pjson::document::deserialize_start
                    ((document *)&local_c8.m_object,(uint8 *)(cfg->_M_dataplus)._M_p);
  uVar17 = local_c8.m_object.m_p;
  if (!bVar6) {
    psVar9 = (string *)__cxa_allocate_exception(0x20);
    *(string **)psVar9 = psVar9 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (psVar9,"Error, bad data. [doc.deserialize_in_place()]","");
    __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
  }
  if (local_b8 != 6) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                  ,999,"int pjson::value_variant::find_key(const char *) const");
  }
  uVar21 = (ulong)local_c8.m_object.m_size;
  if (uVar21 == 0) goto LAB_0010436a;
  psVar15 = &(this->error_msg)._M_string_length;
  uVar16 = 0;
  uVar20 = local_c8.m_object.m_p;
  do {
    pcVar18 = *(char **)uVar20;
    if (pcVar18 == (char *)0x0) {
      pcVar18 = "";
    }
    iVar7 = strcmp("status",pcVar18);
    pcVar18 = "";
    if (iVar7 == 0) {
      if (-1 < (int)uVar16) {
        uVar16 = 0;
        uVar20 = uVar17;
        goto LAB_001042d6;
      }
      break;
    }
    uVar16 = uVar16 + 1;
    uVar20 = uVar20 + 0x34;
  } while (uVar21 != uVar16);
  goto LAB_0010433e;
  while( true ) {
    uVar16 = uVar16 + 1;
    uVar20 = uVar20 + 0x34;
    if (uVar21 == uVar16) break;
LAB_001042d6:
    pcVar19 = *(char **)uVar20;
    if (pcVar19 == (char *)0x0) {
      pcVar19 = "";
    }
    iVar7 = strcmp("data",pcVar19);
    if (iVar7 == 0) {
      if (-1 < (int)uVar16) {
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"status");
        switch((pvVar10->super_value_variant_data).m_type) {
        case cJSONValueTypeBool:
        case cJSONValueTypeInt:
          bVar6 = (pvVar10->super_value_variant_data).m_data.m_object.m_p != (key_value_t *)0x0;
          break;
        case cJSONValueTypeDouble:
          dVar22 = (pvVar10->super_value_variant_data).m_data.m_flVal;
LAB_0010449a:
          bVar6 = (bool)(-(dVar22 != 0.0) & 1);
          break;
        case cJSONValueTypeString:
          pcVar19 = (pvVar10->super_value_variant_data).m_data.m_string.m_p;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
          iVar7 = strcasecmp(pcVar19,"false");
          if (iVar7 == 0) goto switchD_00104330_default;
          iVar7 = strcasecmp(pcVar19,"true");
          if (iVar7 != 0) {
            dVar22 = atof(pcVar19);
            goto LAB_0010449a;
          }
          bVar6 = true;
          break;
        default:
switchD_00104330_default:
          bVar6 = false;
        }
        this->status = bVar6;
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"data");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"file");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size == 0) goto LAB_001047b5;
        pvVar10 = (pvVar10->super_value_variant_data).m_data.m_array.m_p;
        iVar7 = *(int *)((long)&(pvVar10->super_value_variant_data).m_pBufEnd + 4);
        if (iVar7 < 5) goto LAB_00104834;
        iVar1 = *(int *)((long)&(pvVar10->super_value_variant_data).m_pBufStart + 4);
        if (iVar7 != 6) {
          if (iVar1 != 0) {
            plVar12 = *(long **)&(pvVar10->super_value_variant_data).m_type;
            goto LAB_00104503;
          }
LAB_00104853:
          pcVar18 = 
          "const T &pjson::simple_vector<pjson::value_variant, true, pjson::simple_vector_allocator_copy_construction_policy<pjson::value_variant>>::operator[](uint) const [T = pjson::value_variant, UseConstructor = true, ConstructionPolicy = pjson::simple_vector_allocator_copy_construction_policy<pjson::value_variant>]"
          ;
          goto LAB_001047ca;
        }
        if (iVar1 == 0) goto LAB_001047b5;
        plVar12 = (long *)(*(long *)&(pvVar10->super_value_variant_data).m_type + 0x10);
LAB_00104503:
        if ((int)plVar12[2] == 4) {
          pcVar19 = (char *)*plVar12;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
        }
        else {
          **(undefined1 **)((long)plVar12 + 0x1c) = 0;
          pcVar19 = *(char **)((long)plVar12 + 0x14);
        }
        peVar4 = (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sVar3 = (peVar4->str_full)._M_string_length;
        sVar11 = strlen(pcVar19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&peVar4->str_full,0,sVar3,pcVar19,sVar11);
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"data");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"file");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size == 0) goto LAB_001047b5;
        pvVar10 = (pvVar10->super_value_variant_data).m_data.m_array.m_p;
        iVar7 = *(int *)((long)&(pvVar10->super_value_variant_data).m_pBufEnd + 4);
        if (iVar7 < 5) goto LAB_00104834;
        uVar2 = *(uint *)((long)&(pvVar10->super_value_variant_data).m_pBufStart + 4);
        if (iVar7 == 6) {
          lVar13 = 0x44;
          if (uVar2 < 2) goto LAB_001047b5;
        }
        else {
          lVar13 = 0x24;
          if (uVar2 < 2) goto LAB_00104853;
        }
        lVar14 = *(long *)&(pvVar10->super_value_variant_data).m_type;
        if (*(int *)(lVar14 + 0x10 + lVar13) == 4) {
          pcVar19 = *(char **)(lVar14 + lVar13);
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
        }
        else {
          **(undefined1 **)(lVar14 + 0x1c + lVar13) = 0;
          pcVar19 = *(char **)(lVar14 + 0x14 + lVar13);
        }
        peVar4 = (this->url_ptr).super___shared_ptr<JHandler::url,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sVar3 = (peVar4->str_short)._M_string_length;
        sVar11 = strlen(pcVar19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&peVar4->str_short,0,sVar3,pcVar19,sVar11);
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"data");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"file");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size < 2) goto LAB_001047b5;
        lVar13 = (pvVar10->super_value_variant_data).m_data.m_nVal;
        if (*(int *)(lVar13 + 0x54) < 5) goto LAB_00104834;
        if (*(int *)(lVar13 + 0x54) == 6) {
          if (*(int *)(lVar13 + 0x4c) == 0) goto LAB_001047b5;
          plVar12 = (long *)(*(long *)(lVar13 + 0x44) + 0x10);
        }
        else {
          if (*(int *)(lVar13 + 0x4c) == 0) goto LAB_00104853;
          plVar12 = *(long **)(lVar13 + 0x44);
        }
        if ((int)plVar12[2] == 4) {
          pcVar19 = (char *)*plVar12;
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
        }
        else {
          **(undefined1 **)((long)plVar12 + 0x1c) = 0;
          pcVar19 = *(char **)((long)plVar12 + 0x14);
        }
        peVar5 = (this->MD_ptr).super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sVar3 = (peVar5->id)._M_string_length;
        sVar11 = strlen(pcVar19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&peVar5->id,0,sVar3,pcVar19,sVar11);
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"data");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"file");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size < 2) goto LAB_001047b5;
        lVar13 = (pvVar10->super_value_variant_data).m_data.m_nVal;
        if (*(int *)(lVar13 + 0x54) < 5) {
LAB_00104834:
          __assert_fail("is_object_or_array()",
                        "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                        ,0x425,"const value_variant &pjson::value_variant::operator[](int) const");
        }
        if (*(int *)(lVar13 + 0x54) == 6) {
          lVar14 = 0x44;
          if (*(uint *)(lVar13 + 0x4c) < 2) goto LAB_001047b5;
        }
        else {
          lVar14 = 0x24;
          if (*(uint *)(lVar13 + 0x4c) < 2) goto LAB_00104853;
        }
        lVar13 = *(long *)(lVar13 + 0x44);
        if (*(int *)(lVar13 + 0x10 + lVar14) == 4) {
          pcVar19 = *(char **)(lVar13 + lVar14);
          if (pcVar19 == (char *)0x0) {
            pcVar19 = "";
          }
        }
        else {
          **(undefined1 **)(lVar13 + 0x1c + lVar14) = 0;
          pcVar19 = *(char **)(lVar13 + 0x14 + lVar14);
        }
        peVar5 = (this->MD_ptr).super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        sVar3 = (peVar5->name)._M_string_length;
        sVar11 = strlen(pcVar19);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (&peVar5->name,0,sVar3,pcVar19,sVar11);
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"data");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"file");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"metadata");
        pvVar10 = pjson::value_variant::operator[](pvVar10,"size");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size < 2) goto LAB_001047b5;
        lVar13 = (pvVar10->super_value_variant_data).m_data.m_nVal;
        if (*(int *)(lVar13 + 0x54) == 4) {
          if (*(char **)(lVar13 + 0x44) != (char *)0x0) {
            pcVar18 = *(char **)(lVar13 + 0x44);
          }
        }
        else {
          **(undefined1 **)(lVar13 + 0x60) = 0;
          pcVar18 = *(char **)(lVar13 + 0x58);
        }
        peVar5 = (this->MD_ptr).super___shared_ptr<JHandler::metadata,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        this_00 = &peVar5->size;
        psVar15 = &(peVar5->size)._M_string_length;
        goto LAB_001043fa;
      }
      break;
    }
  }
LAB_0010433e:
  uVar16 = 0;
  do {
    pcVar19 = *(char **)uVar17;
    if (pcVar19 == (char *)0x0) {
      pcVar19 = "";
    }
    iVar7 = strcmp("error",pcVar19);
    if (iVar7 == 0) {
      if (-1 < (int)uVar16) {
        pvVar10 = pjson::value_variant::operator[]((value_variant *)&local_c8.m_object,"error");
        if ((pvVar10->super_value_variant_data).m_data.m_object.m_size == 0) {
LAB_001047b5:
          pcVar18 = 
          "const T &pjson::simple_vector<pjson::key_value_t, true, pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>>::operator[](uint) const [T = pjson::key_value_t, UseConstructor = true, ConstructionPolicy = pjson::simple_vector_allocator_copy_construction_policy<pjson::key_value_t>]"
          ;
LAB_001047ca:
          __assert_fail("i < this->m_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                        ,0x1bb,pcVar18);
        }
        pvVar10 = (pvVar10->super_value_variant_data).m_data.m_array.m_p;
        if (*(int *)((long)&(pvVar10->super_value_variant_data).m_pBufEnd + 4) == 4) {
          pcVar19 = *(char **)&(pvVar10->super_value_variant_data).m_type;
          if (pcVar19 != (char *)0x0) {
            pcVar18 = pcVar19;
          }
        }
        else {
          **(undefined1 **)((long)&pvVar10[1].super_value_variant_data.m_data + 8) = 0;
          pcVar18 = pvVar10[1].super_value_variant_data.m_data.m_string.m_p;
        }
LAB_001043fa:
        sVar3 = *psVar15;
        sVar11 = strlen(pcVar18);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                  (this_00,0,sVar3,pcVar18,sVar11);
        free(local_68);
        pjson::pool_allocator::clear(&local_a0);
        return;
      }
      break;
    }
    uVar16 = uVar16 + 1;
    uVar17 = uVar17 + 0x34;
  } while (uVar21 != uVar16);
LAB_0010436a:
  psVar9 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar9 = psVar9 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            (psVar9,"Error, bad JSON format, key [status] not found.","");
  __cxa_throw(psVar9,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

JHandler::JHandler(const std::string &cfg) {
  status = false;
  pjson::document doc;
  try {
    if (doc.deserialize_in_place(const_cast<char*>(cfg.c_str()))) {
      if (doc.has_key("status") && doc.has_key("data")) {
        status = doc["status"].as_bool();
        url_ptr->str_full = doc["data"]["file"].get_object()[0].get_value()[0].as_string_ptr();
        url_ptr->str_short = doc["data"]["file"].get_object()[0].get_value()[1].as_string_ptr();
        MD_ptr->id = doc["data"]["file"].get_object()[1].get_value()[0].as_string_ptr();
        MD_ptr->name = doc["data"]["file"].get_object()[1].get_value()[1].as_string_ptr();
        MD_ptr->size = doc["data"]["file"]["metadata"]["size"].get_object()[1].get_value().as_string_ptr();

#ifdef DEBUG
        std::cout << "[DEBUG|CFG] : status is: " << status << std::endl;
        std::cout << "[DEBUG|CFG] : url full is: " << url_ptr->str_full << std::endl;
        std::cout << "[DEBUG|CFG] : url short is: " << url_ptr->str_short << std::endl;
        std::cout << "[DEBUG|CFG] MD id is: " << MD_ptr->id << std::endl;
        std::cout << "[DEBUG|CFG] MD name is: " << MD_ptr->name << std::endl;
        std::cout << "[DEBUG|CFG] MD size is: " << MD_ptr->size << std::endl;
#endif

      } else if(doc.has_key("error")) {
        error_msg = doc["error"].get_object()[0].get_value().as_string_ptr();
#ifdef DEBUG
        std::cout << "[DEBUG|CFG] error_msg : " << error_msg << std::endl;
#endif
      }
      else
        throw std::string("Error, bad JSON format, key [status] not found.");
    } else
      throw std::string("Error, bad data. [doc.deserialize_in_place()]");
  }
  catch(const std::string& e) {
    std::cerr << e << std::endl;
  }
}